

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O3

TIntermTyped * __thiscall
glslang::HlslParseContext::assignPosition
          (HlslParseContext *this,TSourceLoc *loc,TOperator op,TIntermTyped *left,
          TIntermTyped *right)

{
  TIntermediate *pTVar1;
  int iVar2;
  undefined4 extraout_var;
  TVariable *variable;
  undefined4 extraout_var_00;
  TQualifier *this_00;
  TIntermSymbol *pTVar3;
  TIntermTyped *pTVar4;
  TIntermAggregate *pTVar5;
  TIntermSymbol *base;
  TIntermConstantUnion *index;
  TIntermTyped *pTVar6;
  undefined4 extraout_var_01;
  TType derefType;
  TType local_c8;
  
  pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
  if (pTVar1->invertY == false) {
    pTVar4 = TIntermediate::addAssign(pTVar1,op,left,right,loc);
    return pTVar4;
  }
  iVar2 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x1e])(right);
  variable = makeInternalVariable(this,"@position",(TType *)CONCAT44(extraout_var,iVar2));
  iVar2 = (*(variable->super_TSymbol)._vptr_TSymbol[0xd])(variable);
  this_00 = (TQualifier *)
            (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x50))
                      ((long *)CONCAT44(extraout_var_00,iVar2));
  TQualifier::makeTemporary(this_00);
  pTVar3 = TIntermediate::addSymbol
                     ((this->super_TParseContextBase).super_TParseVersions.intermediate,variable,loc
                     );
  pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
  pTVar4 = TIntermediate::addAssign(pTVar1,EOpAssign,&pTVar3->super_TIntermTyped,right,loc);
  pTVar5 = TIntermediate::growAggregate(pTVar1,(TIntermNode *)0x0,&pTVar4->super_TIntermNode,loc);
  pTVar3 = TIntermediate::addSymbol
                     ((this->super_TParseContextBase).super_TParseVersions.intermediate,variable,loc
                     );
  base = TIntermediate::addSymbol
                   ((this->super_TParseContextBase).super_TParseVersions.intermediate,variable,loc);
  index = TIntermediate::addConstantUnion
                    ((this->super_TParseContextBase).super_TParseVersions.intermediate,1,loc,false);
  pTVar4 = TIntermediate::addIndex
                     ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                      EOpIndexDirect,&pTVar3->super_TIntermTyped,&index->super_TIntermTyped,loc);
  pTVar6 = TIntermediate::addIndex
                     ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                      EOpIndexDirect,&base->super_TIntermTyped,&index->super_TIntermTyped,loc);
  iVar2 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x1e])(right);
  TType::TType(&local_c8,(TType *)CONCAT44(extraout_var_01,iVar2),0,false);
  (*(pTVar4->super_TIntermNode)._vptr_TIntermNode[0x1d])(pTVar4,&local_c8);
  (*(pTVar6->super_TIntermNode)._vptr_TIntermNode[0x1d])(pTVar6,&local_c8);
  pTVar6 = TIntermediate::addUnaryMath
                     ((this->super_TParseContextBase).super_TParseVersions.intermediate,EOpNegative,
                      pTVar6,loc);
  pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
  pTVar4 = TIntermediate::addAssign(pTVar1,EOpAssign,pTVar4,pTVar6,loc);
  pTVar5 = TIntermediate::growAggregate(pTVar1,(TIntermNode *)pTVar5,&pTVar4->super_TIntermNode);
  pTVar3 = TIntermediate::addSymbol
                     ((this->super_TParseContextBase).super_TParseVersions.intermediate,variable,loc
                     );
  pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
  pTVar4 = TIntermediate::addAssign(pTVar1,op,left,&pTVar3->super_TIntermTyped,loc);
  pTVar5 = TIntermediate::growAggregate(pTVar1,(TIntermNode *)pTVar5,&pTVar4->super_TIntermNode);
  if (pTVar5 != (TIntermAggregate *)0x0) {
    (*(pTVar5->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[0x31])
              (pTVar5,1);
    return (TIntermTyped *)pTVar5;
  }
  __assert_fail("assignList != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp"
                ,0xa1e,
                "TIntermTyped *glslang::HlslParseContext::assignPosition(const TSourceLoc &, TOperator, TIntermTyped *, TIntermTyped *)"
               );
}

Assistant:

TIntermTyped* HlslParseContext::assignPosition(const TSourceLoc& loc, TOperator op,
                                               TIntermTyped* left, TIntermTyped* right)
{
    // If we are not asked for Y inversion, use a plain old assign.
    if (!intermediate.getInvertY())
        return intermediate.addAssign(op, left, right, loc);

    // If we get here, we should invert Y.
    TIntermAggregate* assignList = nullptr;

    // If this is a complex rvalue, we don't want to dereference it many times.  Create a temporary.
    TVariable* rhsTempVar = nullptr;
    rhsTempVar = makeInternalVariable("@position", right->getType());
    rhsTempVar->getWritableType().getQualifier().makeTemporary();

    {
        TIntermTyped* rhsTempSym = intermediate.addSymbol(*rhsTempVar, loc);
        assignList = intermediate.growAggregate(assignList,
                                                intermediate.addAssign(EOpAssign, rhsTempSym, right, loc), loc);
    }

    // pos.y = -pos.y
    {
        const int Y = 1;

        TIntermTyped* tempSymL = intermediate.addSymbol(*rhsTempVar, loc);
        TIntermTyped* tempSymR = intermediate.addSymbol(*rhsTempVar, loc);
        TIntermTyped* index = intermediate.addConstantUnion(Y, loc);

        TIntermTyped* lhsElement = intermediate.addIndex(EOpIndexDirect, tempSymL, index, loc);
        TIntermTyped* rhsElement = intermediate.addIndex(EOpIndexDirect, tempSymR, index, loc);

        const TType derefType(right->getType(), 0);

        lhsElement->setType(derefType);
        rhsElement->setType(derefType);

        TIntermTyped* yNeg = intermediate.addUnaryMath(EOpNegative, rhsElement, loc);

        assignList = intermediate.growAggregate(assignList, intermediate.addAssign(EOpAssign, lhsElement, yNeg, loc));
    }

    // Assign the rhs temp (now with Y inversion) to the final output
    {
        TIntermTyped* rhsTempSym = intermediate.addSymbol(*rhsTempVar, loc);
        assignList = intermediate.growAggregate(assignList, intermediate.addAssign(op, left, rhsTempSym, loc));
    }

    assert(assignList != nullptr);
    assignList->setOperator(EOpSequence);

    return assignList;
}